

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

bool __thiscall
QHttpNetworkRequestPrivate::operator==
          (QHttpNetworkRequestPrivate *this,QHttpNetworkRequestPrivate *other)

{
  bool bVar1;
  
  bVar1 = QHttpNetworkHeaderPrivate::operator==
                    (&this->super_QHttpNetworkHeaderPrivate,&other->super_QHttpNetworkHeaderPrivate)
  ;
  if ((((((bVar1) && (this->operation == other->operation)) &&
        (bVar1 = comparesEqual(&this->fullLocalServerName,&other->fullLocalServerName), bVar1)) &&
       (((this->priority == other->priority && (this->uploadByteDevice == other->uploadByteDevice))
        && ((this->autoDecompress == other->autoDecompress &&
            ((this->pipeliningAllowed == other->pipeliningAllowed &&
             (this->http2Allowed == other->http2Allowed)))))))) &&
      ((this->http2Direct == other->http2Direct &&
       (((this->h2cAllowed == other->h2cAllowed &&
         ((((this->operation != Custom ||
            (bVar1 = ::operator==(&this->customVerb,&other->customVerb), bVar1)) &&
           (this->withCredentials == other->withCredentials)) &&
          ((this->ssl == other->ssl && (this->preConnect == other->preConnect)))))) &&
        (this->redirectPolicy == other->redirectPolicy)))))) &&
     (bVar1 = comparesEqual(&this->peerVerifyName,&other->peerVerifyName), bVar1)) {
    return this->needResendWithCredentials == other->needResendWithCredentials;
  }
  return false;
}

Assistant:

bool QHttpNetworkRequestPrivate::operator==(const QHttpNetworkRequestPrivate &other) const
{
    return QHttpNetworkHeaderPrivate::operator==(other)
        && (operation == other.operation)
        && (fullLocalServerName == other.fullLocalServerName)
        && (priority == other.priority)
        && (uploadByteDevice == other.uploadByteDevice)
        && (autoDecompress == other.autoDecompress)
        && (pipeliningAllowed == other.pipeliningAllowed)
        && (http2Allowed == other.http2Allowed)
        && (http2Direct == other.http2Direct)
        && (h2cAllowed == other.h2cAllowed)
        // we do not clear the customVerb in setOperation
        && (operation != QHttpNetworkRequest::Custom || (customVerb == other.customVerb))
        && (withCredentials == other.withCredentials)
        && (ssl == other.ssl)
        && (preConnect == other.preConnect)
        && (redirectPolicy == other.redirectPolicy)
        && (peerVerifyName == other.peerVerifyName)
        && (needResendWithCredentials == other.needResendWithCredentials)
        ;
}